

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  Arena **__mutex;
  long *plVar1;
  char **ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Logger *info_log;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  undefined4 extraout_var;
  Iterator *iter;
  undefined4 extraout_var_00;
  long lVar7;
  Version *in_R8;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar8;
  Slice min_user_key;
  FileMetaData meta;
  Slice max_user_key;
  string local_d0;
  Version *local_b0;
  Version *local_a8;
  long local_a0;
  FileMetaData local_98;
  Slice local_40;
  
  local_b0 = base;
  local_a8 = in_R8;
  iVar6 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  local_98.smallest.rep_._M_dataplus._M_p = (pointer)&local_98.smallest.rep_.field_2;
  local_98.refs = 0;
  local_98.allowed_seeks = 0x40000000;
  local_98.file_size = 0;
  local_98.smallest.rep_._M_string_length = 0;
  local_98.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_98.largest.rep_._M_dataplus._M_p = (pointer)&local_98.largest.rep_.field_2;
  local_98.largest.rep_._M_string_length = 0;
  local_98.largest.rep_.field_2._M_local_buf[0] = '\0';
  lVar7 = *(long *)&mem[4].table_.max_height_;
  local_98.number = *(uint64_t *)(lVar7 + 0x48);
  *(uint64_t *)(lVar7 + 0x48) = local_98.number + 1;
  this_00 = &mem[4].arena_.blocks_;
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)this_00,&local_98.number);
  local_a0 = CONCAT44(extraout_var,iVar6);
  iter = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",local_98.number);
  __mutex = &mem[1].table_.arena_;
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  BuildTable((leveldb *)&local_d0,(string *)&mem[1].arena_.blocks_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (TableCache *)mem[1].table_.compare_.comparator.super_Comparator._vptr_Comparator,iter,
             &local_98);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this->super_DB)._vptr_DB;
  (this->super_DB)._vptr_DB = (_func_int **)local_d0._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar3;
  if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    operator_delete__(paVar3);
  }
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar5 = local_98.file_size;
  uVar4 = local_98.number;
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
  Status::ToString_abi_cxx11_(&local_d0,(Status *)this);
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar4,uVar5,local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (iter != (Iterator *)0x0) {
    (*iter->_vptr_Iterator[1])(iter);
  }
  pVar8 = std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)this_00,&local_98.number);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)this_00,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
  if (local_98.file_size != 0 && (this->super_DB)._vptr_DB == (_func_int **)0x0) {
    if (7 < local_98.smallest.rep_._M_string_length) {
      local_d0._M_string_length = local_98.smallest.rep_._M_string_length - 8;
      local_d0._M_dataplus._M_p = local_98.smallest.rep_._M_dataplus._M_p;
      if (7 < local_98.largest.rep_._M_string_length) {
        local_40.size_ = local_98.largest.rep_._M_string_length - 8;
        local_40.data_ = local_98.largest.rep_._M_dataplus._M_p;
        if (local_a8 == (Version *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = Version::PickLevelForMemTableOutput(local_a8,(Slice *)&local_d0,&local_40);
        }
        VersionEdit::AddFile
                  ((VersionEdit *)local_b0,iVar6,local_98.number,local_98.file_size,
                   &local_98.smallest,&local_98.largest);
        lVar7 = (long)iVar6;
        goto LAB_0010fb30;
      }
    }
    __assert_fail("internal_key.size() >= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                  ,0x5e,"Slice leveldb::ExtractUserKey(const Slice &)");
  }
  lVar7 = 0;
LAB_0010fb30:
  iVar6 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x13])();
  plVar1 = (long *)((long)&mem[5].comparator_ + lVar7 * 0x18 + 8);
  *plVar1 = *plVar1 + (CONCAT44(extraout_var_00,iVar6) - local_a0);
  ppcVar2 = &mem[5].arena_.alloc_ptr_ + lVar7 * 3;
  *ppcVar2 = *ppcVar2 + local_98.file_size;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.largest.rep_._M_dataplus._M_p != &local_98.largest.rep_.field_2) {
    operator_delete(local_98.largest.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.smallest.rep_._M_dataplus._M_p != &local_98.smallest.rep_.field_2) {
    operator_delete(local_98.smallest.rep_._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}